

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ev3dev.h
# Opt level: O1

led * __thiscall ev3dev::led::set_delay_on(led *__return_storage_ptr__,led *this,int v)

{
  pointer pcVar1;
  undefined4 uVar2;
  string local_48;
  
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"delay_on","");
  device::set_attr_int(&this->super_device,&local_48,v);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  (__return_storage_ptr__->super_device)._path._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->super_device)._path.field_2;
  pcVar1 = (this->super_device)._path._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar1,
             pcVar1 + (this->super_device)._path._M_string_length);
  uVar2 = *(undefined4 *)&(this->super_device).field_0x24;
  (__return_storage_ptr__->super_device)._device_index = (this->super_device)._device_index;
  *(undefined4 *)&(__return_storage_ptr__->super_device).field_0x24 = uVar2;
  return __return_storage_ptr__;
}

Assistant:

led set_delay_on(int v) {
            set_attr_int("delay_on", v);
            return *this;
        }